

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O0

UBool __thiscall icu_63::MeasureUnit::operator==(MeasureUnit *this,UObject *other)

{
  bool bVar1;
  int iVar2;
  bool local_31;
  MeasureUnit *rhs;
  UObject *other_local;
  MeasureUnit *this_local;
  
  if (this == (MeasureUnit *)other) {
    this_local._7_1_ = true;
  }
  else {
    if (this == (MeasureUnit *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator!=
                      ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                       (type_info *)other->_vptr_UObject[-1]);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_31 = false;
      if ((this->fTypeId == *(int *)&other[1]._vptr_UObject) &&
         (local_31 = false, this->fSubTypeId == *(int *)((long)&other[1]._vptr_UObject + 4))) {
        iVar2 = strcmp(this->fCurrency,(char *)(other + 2));
        local_31 = iVar2 == 0;
      }
      this_local._7_1_ = local_31;
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool MeasureUnit::operator==(const UObject& other) const {
    if (this == &other) {  // Same object, equal
        return TRUE;
    }
    if (typeid(*this) != typeid(other)) { // Different types, not equal
        return FALSE;
    }
    const MeasureUnit &rhs = static_cast<const MeasureUnit&>(other);
    return (
            fTypeId == rhs.fTypeId
            && fSubTypeId == rhs.fSubTypeId
            && uprv_strcmp(fCurrency, rhs.fCurrency) == 0);
}